

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

void duckdb::DatePartFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  reference pvVar2;
  idx_t iVar3;
  undefined8 in_RDX;
  DataChunk *in_RDI;
  value_type *date_arg;
  value_type *spec_arg;
  size_type in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  
  pvVar1 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar3 = DataChunk::size(in_RDI);
  BinaryExecutor::
  ExecuteWithNulls<duckdb::string_t,duckdb::timestamp_t,long,duckdb::DatePartFunction<duckdb::timestamp_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
            (pvVar1,pvVar2,in_RDX,iVar3);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}